

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall libtorrent::aux::session_impl::get_listen_port(session_impl *this)

{
  listen_socket_handle *in_RDX;
  transport in_SIL;
  
  get_listen_port((session_impl *)&this[-1].m_deferred_submit_disk_jobs,in_SIL,in_RDX);
  return;
}

Assistant:

int session_impl::get_listen_port(transport const ssl, aux::listen_socket_handle const& s) const
	{
		auto* socket = s.get();
		if (socket->ssl != ssl)
		{
			auto alt_socket = std::find_if(m_listen_sockets.begin(), m_listen_sockets.end()
				, [&](std::shared_ptr<listen_socket_t> const& e)
			{
				return e->ssl == ssl
					&& e->external_address.external_address()
						== socket->external_address.external_address();
			});
			if (alt_socket != m_listen_sockets.end())
				socket = alt_socket->get();
		}
		return socket->udp_external_port();
	}